

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::AssocArrayExistsMethod::eval
          (AssocArrayExistsMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  undefined1 uVar1;
  undefined1 uVar2;
  key_type *__x;
  AssociativeArray *this_00;
  SVInt *integer;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  bool exists;
  ConstantValue index;
  ConstantValue array;
  nullptr_t in_stack_ffffffffffffff28;
  EvalContext *in_stack_ffffffffffffff30;
  Expression *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  uVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x92f4ab);
  if (((bool)uVar1) &&
     (uVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x92f4c5), (bool)uVar2))
  {
    __x = (key_type *)slang::ConstantValue::map((ConstantValue *)0x92f525);
    this_00 = CopyPtr<slang::AssociativeArray>::operator->
                        ((CopyPtr<slang::AssociativeArray> *)0x92f536);
    integer = (SVInt *)std::
                       map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                       ::count((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                                *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff40)),__x);
    SVInt::SVInt((SVInt *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff40)),
                 (bitwidth_t)((ulong)__x >> 0x20),(uint64_t)this_00,SUB81((ulong)integer >> 0x38,0))
    ;
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00,integer);
    SVInt::~SVInt((SVInt *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff40)));
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x92f5c7);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x92f5d4);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto array = args[0]->eval(context);
        auto index = args[1]->eval(context);
        if (!array || !index)
            return nullptr;

        bool exists = array.map()->count(index);
        return SVInt(32, exists ? 1 : 0, true);
    }